

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::regionDisplayName
          (LocaleDisplayNamesImpl *this,char *region,UnicodeString *result,UBool skipAdjust)

{
  UBool UVar1;
  UnicodeString *local_48;
  UnicodeString *local_40;
  UBool skipAdjust_local;
  UnicodeString *result_local;
  char *region_local;
  LocaleDisplayNamesImpl *this_local;
  
  if (this->nameLength == UDISPCTX_LENGTH_SHORT) {
    ICUDataTable::get(&this->regionData,"Countries%short",region,result);
    UVar1 = UnicodeString::isBogus(result);
    if (UVar1 == '\0') {
      local_40 = result;
      if (skipAdjust == '\0') {
        local_40 = adjustForUsageAndContext(this,kCapContextUsageTerritory,result);
      }
      return local_40;
    }
  }
  ICUDataTable::get(&this->regionData,"Countries",region,result);
  local_48 = result;
  if (skipAdjust == '\0') {
    local_48 = adjustForUsageAndContext(this,kCapContextUsageTerritory,result);
  }
  return local_48;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::regionDisplayName(const char* region,
                                          UnicodeString& result,
                                          UBool skipAdjust) const {
    if (nameLength == UDISPCTX_LENGTH_SHORT) {
        regionData.get("Countries%short", region, result);
        if (!result.isBogus()) {
            return skipAdjust? result: adjustForUsageAndContext(kCapContextUsageTerritory, result);
        }
    }
    regionData.get("Countries", region, result);
    return skipAdjust? result: adjustForUsageAndContext(kCapContextUsageTerritory, result);
}